

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbi_aa64_vae1_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  int iVar2;
  CPUState *src_cpu;
  target_ulong addr;
  uint64_t pageaddr;
  int mask;
  CPUState *cs;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  src_cpu = env_cpu(env);
  iVar2 = vae1_tlbmask(env);
  addr = sextract64(value << 0xc,0,0x38);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_page_by_mmuidx_all_cpus_synced_aarch64(src_cpu,addr,(uint16_t)iVar2);
  }
  else {
    tlb_flush_page_by_mmuidx_aarch64(src_cpu,addr,(uint16_t)iVar2);
  }
  return;
}

Assistant:

static void tlbi_aa64_vae1_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                 uint64_t value)
{
    /* Invalidate by VA, EL1&0 (AArch64 version).
     * Currently handles all of VAE1, VAAE1, VAALE1 and VALE1,
     * since we don't support flush-for-specific-ASID-only or
     * flush-last-level-only.
     */
    CPUState *cs = env_cpu(env);
    int mask = vae1_tlbmask(env);
    uint64_t pageaddr = sextract64(value << 12, 0, 56);

    if (tlb_force_broadcast(env)) {
        tlb_flush_page_by_mmuidx_all_cpus_synced(cs, pageaddr, mask);
    } else {
        tlb_flush_page_by_mmuidx(cs, pageaddr, mask);
    }
}